

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::Not(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  Variable var;
  Variable VVar3;
  
  VVar3 = popOpStack(this);
  var.field_1 = VVar3.field_1;
  var._4_4_ = 0;
  var.type = VVar3.type;
  bVar2 = booleanValueOfVariable(this,var);
  VVar3.field_1.boolValue = !bVar2;
  VVar3._0_8_ = 2;
  VVar3.field_1.integerValue._1_7_ = 0;
  pushOpStack(this,VVar3);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Not() {
  Variable top = this->popOpStack();
  this->pushBoolean(!this->booleanValueOfVariable(top));
  this->advance();
}